

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::rfind_lower(StringRef *this,char C,size_t From)

{
  char cVar1;
  char cVar2;
  unsigned_long *puVar3;
  unsigned_long local_30;
  size_t i;
  size_t From_local;
  StringRef *pSStack_18;
  char C_local;
  StringRef *this_local;
  
  i = From;
  From_local._7_1_ = C;
  pSStack_18 = this;
  puVar3 = std::min<unsigned_long>(&i,&this->Length);
  local_30 = *puVar3;
  i = local_30;
  do {
    if (local_30 == 0) {
      return 0xffffffffffffffff;
    }
    local_30 = local_30 - 1;
    cVar1 = toLower(this->Data[local_30]);
    cVar2 = toLower(From_local._7_1_);
  } while (cVar1 != cVar2);
  return local_30;
}

Assistant:

size_t StringRef::rfind_lower(char C, size_t From) const {
  From = std::min(From, Length);
  size_t i = From;
  while (i != 0) {
    --i;
    if (toLower(Data[i]) == toLower(C))
      return i;
  }
  return npos;
}